

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptCompilationUnit(HlslGrammar *this)

{
  TIntermNode **nodeList;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *right;
  bool bVar3;
  
  nodeList = &this->unitNode;
  bVar1 = acceptDeclarationList(this,nodeList);
  bVar3 = false;
  if (bVar1) {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokNone);
    bVar3 = false;
    if (bVar1) {
      if (*nodeList == (TIntermNode *)0x0) {
        right = (TIntermAggregate *)0x0;
      }
      else {
        iVar2 = (*(*nodeList)->_vptr_TIntermNode[6])();
        right = (TIntermAggregate *)*nodeList;
        if (CONCAT44(extraout_var,iVar2) == 0) {
          right = TIntermediate::growAggregate
                            (this->intermediate,(TIntermNode *)0x0,(TIntermNode *)right);
          this->unitNode = (TIntermNode *)right;
        }
      }
      this->intermediate->treeRoot = (TIntermNode *)right;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool HlslGrammar::acceptCompilationUnit()
{
    if (! acceptDeclarationList(unitNode))
        return false;

    if (! peekTokenClass(EHTokNone))
        return false;

    // set root of AST
    if (unitNode && !unitNode->getAsAggregate())
        unitNode = intermediate.growAggregate(nullptr, unitNode);
    intermediate.setTreeRoot(unitNode);

    return true;
}